

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDEdgePtr __thiscall
ON_SubD_FixedSizeHeap::FindOrAllocateEdge
          (ON_SubD_FixedSizeHeap *this,ON_SubDVertex *v0,double v0_sector_coefficient,
          ON_SubDVertex *v1,double v1_sector_coefficient)

{
  ON_SubDVertex *pOVar1;
  ON_SubDEdgePtr OVar2;
  ON_SubDEdgePtr local_48;
  ON_SubDEdgePtr ep;
  unsigned_short v0ei;
  double v1_sector_coefficient_local;
  ON_SubDVertex *v1_local;
  double v0_sector_coefficient_local;
  ON_SubDVertex *v0_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  if ((v0 == (ON_SubDVertex *)0x0) || (v0->m_edges == (ON_SubDEdgePtr *)0x0)) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubD_FixedSizeHeap *)0;
  }
  else if ((v1 == (ON_SubDVertex *)0x0) || (v1->m_edges == (ON_SubDEdgePtr *)0x0)) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubD_FixedSizeHeap *)0;
  }
  else {
    for (ep.m_ptr._6_2_ = 0; ep.m_ptr._6_2_ < v0->m_edge_count; ep.m_ptr._6_2_ = ep.m_ptr._6_2_ + 1)
    {
      local_48.m_ptr = v0->m_edges[ep.m_ptr._6_2_].m_ptr;
      pOVar1 = ON_SubDEdgePtr::RelativeVertex(&local_48,0);
      if (v0 == pOVar1) {
        pOVar1 = ON_SubDEdgePtr::RelativeVertex(&local_48,1);
        if (v1 == pOVar1) {
          return (ON_SubDEdgePtr)local_48.m_ptr;
        }
      }
      else {
        pOVar1 = ON_SubDEdgePtr::RelativeVertex(&local_48,1);
        if (v0 == pOVar1) {
          pOVar1 = ON_SubDEdgePtr::RelativeVertex(&local_48,0);
          if (v1 == pOVar1) {
            OVar2 = ON_SubDEdgePtr::Reversed(&local_48);
            return (ON_SubDEdgePtr)OVar2.m_ptr;
          }
        }
        else {
          ON_SubDIncrementErrorCount();
        }
      }
    }
    this_local = (ON_SubD_FixedSizeHeap *)
                 AllocateEdge(this,v0,v0_sector_coefficient,v1,v1_sector_coefficient);
  }
  return (ON_SubDEdgePtr)(ON__UINT_PTR)this_local;
}

Assistant:

const ON_SubDEdgePtr ON_SubD_FixedSizeHeap::FindOrAllocateEdge(
  ON_SubDVertex * v0,
  double v0_sector_coefficient,
  ON_SubDVertex * v1,
  double v1_sector_coefficient
)
{
  if ( nullptr == v0 || nullptr == v0->m_edges)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  if ( nullptr == v1 || nullptr == v1->m_edges)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  for (unsigned short v0ei = 0; v0ei < v0->m_edge_count; ++v0ei)
  {
    const ON_SubDEdgePtr ep = v0->m_edges[v0ei];
    if (v0 == ep.RelativeVertex(0))
    {
      if (v1 == ep.RelativeVertex(1))
        return ep;
    }
    else if (v0 == ep.RelativeVertex(1))
    {
      if (v1 == ep.RelativeVertex(0))
        return ep.Reversed();
    }
    else
    {
      ON_SUBD_RETURN_ERROR("Invalid ON_SubDEdgePtr in vertex->m_edge[] array");
    }
  }

  return AllocateEdge(v0, v0_sector_coefficient, v1, v1_sector_coefficient);
}